

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  seqDef *psVar4;
  int iVar5;
  bool bVar6;
  undefined8 uVar7;
  seqStore_t *psVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  long lVar17;
  ulong uVar18;
  int *piVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  size_t offbaseFound;
  size_t local_b8;
  ulong local_b0;
  ulong local_a8;
  int *local_a0;
  int *local_98;
  uint local_8c;
  seqStore_t *local_88;
  int *local_80;
  BYTE *local_78;
  int *local_70;
  uint local_64;
  ZSTD_matchState_t *local_60;
  BYTE *local_58;
  int *local_50;
  BYTE *local_48;
  BYTE *local_40;
  uint *local_38;
  
  pBVar2 = (ms->window).base;
  local_8c = (ms->window).dictLimit;
  local_a8 = (ulong)local_8c;
  uVar9 = (ms->cParams).minMatch;
  uVar11 = 6;
  if (uVar9 < 6) {
    uVar11 = uVar9;
  }
  uVar9 = 4;
  if (4 < uVar11) {
    uVar9 = uVar11;
  }
  local_78 = pBVar2 + local_a8;
  uVar11 = *rep;
  pZVar3 = ms->dictMatchState;
  local_80 = (int *)(pZVar3->window).nextSrc;
  local_58 = (pZVar3->window).base;
  local_40 = local_58 + (pZVar3->window).dictLimit;
  uVar10 = ((int)src - ((int)local_78 + (int)local_40)) + (int)local_80;
  piVar19 = (int *)((long)src + (ulong)(uVar10 == 0));
  local_98 = (int *)src;
  if (uVar10 < uVar11) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar23 = rep[1];
  if (uVar10 < uVar23) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_70 = (int *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  if (piVar19 < local_70) {
    local_8c = ((int)local_58 - (int)local_80) + local_8c;
    local_48 = local_58 + -(ulong)local_8c;
    local_50 = iEnd + -8;
    local_88 = seqStore;
    local_60 = ms;
    local_38 = rep;
    do {
      local_a0 = (int *)((long)piVar19 + 1);
      iVar25 = (int)pBVar2;
      uVar10 = (((int)piVar19 - iVar25) - uVar11) + 1;
      piVar16 = (int *)(pBVar2 + uVar10);
      if (uVar10 < (uint)local_a8) {
        piVar16 = (int *)(local_58 + (uVar10 - local_8c));
      }
      local_64 = uVar23;
      if ((uVar10 - (uint)local_a8 < 0xfffffffd) && (*piVar16 == *local_a0)) {
        piVar14 = iEnd;
        if (uVar10 < (uint)local_a8) {
          piVar14 = local_80;
        }
        sVar12 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar16 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar14,local_78);
        uVar18 = sVar12 + 4;
      }
      else {
        uVar18 = 0;
      }
      pZVar3 = local_60;
      local_b8 = 999999999;
      if (uVar9 == 6) {
        uVar13 = ZSTD_BtFindBestMatch_dictMatchState_6
                           (local_60,(BYTE *)piVar19,(BYTE *)iEnd,&local_b8);
      }
      else if (uVar9 == 5) {
        uVar13 = ZSTD_BtFindBestMatch_dictMatchState_5
                           (local_60,(BYTE *)piVar19,(BYTE *)iEnd,&local_b8);
      }
      else {
        uVar13 = ZSTD_BtFindBestMatch_dictMatchState_4
                           (local_60,(BYTE *)piVar19,(BYTE *)iEnd,&local_b8);
      }
      uVar24 = uVar18;
      if (uVar18 < uVar13) {
        uVar24 = uVar13;
      }
      if (uVar24 < 4) {
        uVar18 = (long)piVar19 - (long)local_98;
        piVar19 = (int *)((long)piVar19 + (uVar18 >> 8) + 1);
        pZVar3->lazySkipping = (uint)(0x7ff < uVar18);
        uVar23 = local_64;
      }
      else {
        piVar16 = piVar19;
        local_b0 = local_b8;
        if (uVar13 <= uVar18) {
          local_b0 = 1;
          piVar16 = local_a0;
        }
        local_a0 = piVar16;
        if (piVar19 < local_70) {
          do {
            piVar16 = (int *)((long)piVar19 + 1);
            uVar10 = ((int)piVar16 - iVar25) - uVar11;
            piVar14 = (int *)(pBVar2 + uVar10);
            if (uVar10 < (uint)local_a8) {
              piVar14 = (int *)(local_58 + (uVar10 - local_8c));
            }
            if ((uVar10 - (uint)local_a8 < 0xfffffffd) && (*piVar14 == *piVar16)) {
              piVar15 = iEnd;
              if (uVar10 < (uint)local_a8) {
                piVar15 = local_80;
              }
              sVar12 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar14 + 1),(BYTE *)iEnd,
                                  (BYTE *)piVar15,local_78);
              if (sVar12 < 0xfffffffffffffffc) {
                uVar10 = 0x1f;
                if ((uint)local_b0 != 0) {
                  for (; (uint)local_b0 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                }
                if ((int)((uVar10 ^ 0x1f) + (int)uVar24 * 3 + -0x1e) < (int)(sVar12 + 4) * 3) {
                  local_b0 = 1;
                  uVar24 = sVar12 + 4;
                  local_a0 = piVar16;
                }
              }
            }
            local_b8 = 999999999;
            if (uVar9 == 6) {
              uVar18 = ZSTD_BtFindBestMatch_dictMatchState_6
                                 (pZVar3,(BYTE *)piVar16,(BYTE *)iEnd,&local_b8);
            }
            else if (uVar9 == 5) {
              uVar18 = ZSTD_BtFindBestMatch_dictMatchState_5
                                 (pZVar3,(BYTE *)piVar16,(BYTE *)iEnd,&local_b8);
            }
            else {
              uVar18 = ZSTD_BtFindBestMatch_dictMatchState_4
                                 (pZVar3,(BYTE *)piVar16,(BYTE *)iEnd,&local_b8);
            }
            bVar6 = true;
            if (3 < uVar18) {
              uVar10 = 0x1f;
              if ((uint)local_b0 != 0) {
                for (; (uint)local_b0 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              iVar5 = 0x1f;
              if ((uint)local_b8 != 0) {
                for (; (uint)local_b8 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              if ((int)((uVar10 ^ 0x1f) + (int)uVar24 * 4 + -0x1b) < (int)uVar18 * 4 - iVar5) {
                bVar6 = false;
                local_b0 = local_b8;
                uVar24 = uVar18;
                local_a0 = piVar16;
              }
            }
            if (bVar6) {
              if (local_70 <= piVar16) break;
              piVar16 = (int *)((long)piVar19 + 2);
              uVar10 = ((int)piVar16 - iVar25) - uVar11;
              piVar14 = (int *)(pBVar2 + uVar10);
              if (uVar10 < (uint)local_a8) {
                piVar14 = (int *)(local_58 + (uVar10 - local_8c));
              }
              if ((uVar10 - (uint)local_a8 < 0xfffffffd) && (*piVar14 == *piVar16)) {
                piVar15 = iEnd;
                if (uVar10 < (uint)local_a8) {
                  piVar15 = local_80;
                }
                sVar12 = ZSTD_count_2segments
                                   ((BYTE *)((long)piVar19 + 6),(BYTE *)(piVar14 + 1),(BYTE *)iEnd,
                                    (BYTE *)piVar15,local_78);
                if (sVar12 < 0xfffffffffffffffc) {
                  uVar10 = 0x1f;
                  if ((uint)local_b0 != 0) {
                    for (; (uint)local_b0 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                    }
                  }
                  if ((int)((uVar10 ^ 0x1f) + (int)uVar24 * 4 + -0x1e) < (int)(sVar12 + 4) * 4) {
                    local_b0 = 1;
                    uVar24 = sVar12 + 4;
                    local_a0 = piVar16;
                  }
                }
              }
              local_b8 = 999999999;
              if (uVar9 == 6) {
                uVar18 = ZSTD_BtFindBestMatch_dictMatchState_6
                                   (pZVar3,(BYTE *)piVar16,(BYTE *)iEnd,&local_b8);
              }
              else if (uVar9 == 5) {
                uVar18 = ZSTD_BtFindBestMatch_dictMatchState_5
                                   (pZVar3,(BYTE *)piVar16,(BYTE *)iEnd,&local_b8);
              }
              else {
                uVar18 = ZSTD_BtFindBestMatch_dictMatchState_4
                                   (pZVar3,(BYTE *)piVar16,(BYTE *)iEnd,&local_b8);
              }
              bVar6 = true;
              if (3 < uVar18) {
                uVar10 = 0x1f;
                if ((uint)local_b0 != 0) {
                  for (; (uint)local_b0 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                }
                iVar5 = 0x1f;
                if ((uint)local_b8 != 0) {
                  for (; (uint)local_b8 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                  }
                }
                if ((int)((uVar10 ^ 0x1f) + (int)uVar24 * 4 + -0x18) < (int)uVar18 * 4 - iVar5) {
                  bVar6 = false;
                  local_b0 = local_b8;
                  uVar24 = uVar18;
                  local_a0 = piVar16;
                }
              }
              if (bVar6) break;
            }
            piVar19 = piVar16;
          } while (piVar16 < local_70);
        }
        piVar19 = local_a0;
        uVar10 = uVar11;
        uVar23 = local_64;
        if (3 < local_b0) {
          pBVar20 = (BYTE *)((long)local_a0 + (-(long)pBVar2 - local_b0) + -0xfffffffd);
          pBVar21 = pBVar2;
          pBVar22 = local_78;
          if ((uint)pBVar20 < (uint)local_a8) {
            pBVar21 = local_48;
            pBVar22 = local_40;
          }
          if ((local_98 < local_a0) &&
             (uVar18 = (ulong)pBVar20 & 0xffffffff, pBVar22 < pBVar21 + uVar18)) {
            pBVar21 = pBVar21 + uVar18;
            do {
              pBVar21 = pBVar21 + -1;
              piVar16 = (int *)((long)piVar19 + -1);
              if ((*(BYTE *)piVar16 != *pBVar21) ||
                 (uVar24 = uVar24 + 1, piVar19 = piVar16, piVar16 <= local_98)) break;
            } while (pBVar22 < pBVar21);
          }
          uVar10 = (int)local_b0 - 3;
          uVar23 = uVar11;
        }
        if (local_88->maxNbSeq <=
            (ulong)((long)local_88->sequences - (long)local_88->sequencesStart >> 3)) {
LAB_001601e6:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_88->maxNbLit) {
LAB_00160243:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar18 = (long)piVar19 - (long)local_98;
        pBVar22 = local_88->lit;
        if (local_88->litStart + local_88->maxNbLit < pBVar22 + uVar18) {
LAB_00160262:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < piVar19) {
LAB_00160224:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < piVar19) {
          ZSTD_safecopyLiterals(pBVar22,(BYTE *)local_98,(BYTE *)piVar19,(BYTE *)local_50);
        }
        else {
          uVar7 = *(undefined8 *)(local_98 + 2);
          *(undefined8 *)pBVar22 = *(undefined8 *)local_98;
          *(undefined8 *)(pBVar22 + 8) = uVar7;
          if (0x10 < uVar18) {
            pBVar22 = local_88->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar22 + 0x10 + (-0x10 - (long)(local_98 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(undefined8 *)(local_98 + 6);
            *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(local_98 + 4);
            *(undefined8 *)(pBVar22 + 0x18) = uVar7;
            if (0x20 < (long)uVar18) {
              lVar17 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_98 + lVar17 + 0x20);
                uVar7 = puVar1[1];
                pBVar21 = pBVar22 + lVar17 + 0x20;
                *(undefined8 *)pBVar21 = *puVar1;
                *(undefined8 *)(pBVar21 + 8) = uVar7;
                puVar1 = (undefined8 *)((long)local_98 + lVar17 + 0x30);
                uVar7 = puVar1[1];
                *(undefined8 *)(pBVar21 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar21 + 0x18) = uVar7;
                lVar17 = lVar17 + 0x20;
              } while (pBVar21 + 0x20 < pBVar22 + uVar18);
            }
          }
        }
        psVar8 = local_88;
        local_88->lit = local_88->lit + uVar18;
        if (0xffff < uVar18) {
          if (local_88->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_88->longLengthType = ZSTD_llt_literalLength;
          local_88->longLengthPos =
               (U32)((ulong)((long)local_88->sequences - (long)local_88->sequencesStart) >> 3);
        }
        psVar4 = local_88->sequences;
        psVar4->litLength = (U16)uVar18;
        psVar4->offBase = (U32)local_b0;
        if (uVar24 < 3) {
LAB_00160205:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar24 - 3) {
          if (local_88->longLengthType != ZSTD_llt_none) {
LAB_00160281:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_88->longLengthType = ZSTD_llt_matchLength;
          local_88->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_88->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar24 - 3);
        local_88->sequences = psVar4 + 1;
        if (local_60->lazySkipping != 0) {
          local_60->lazySkipping = 0;
        }
        piVar19 = (int *)((long)piVar19 + uVar24);
        pBVar22 = local_48;
        local_98 = piVar19;
        do {
          uVar11 = uVar10;
          if (local_70 < piVar19) break;
          uVar11 = ((int)piVar19 - iVar25) - uVar23;
          pBVar21 = pBVar2;
          if (uVar11 < (uint)local_a8) {
            pBVar21 = pBVar22;
          }
          if ((uVar11 - (uint)local_a8 < 0xfffffffd) && (*(int *)(pBVar21 + uVar11) == *piVar19)) {
            piVar16 = iEnd;
            if (uVar11 < (uint)local_a8) {
              piVar16 = local_80;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)(piVar19 + 1),(BYTE *)((long)(pBVar21 + uVar11) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar16,local_78);
            if (psVar8->maxNbSeq <=
                (ulong)((long)psVar8->sequences - (long)psVar8->sequencesStart >> 3))
            goto LAB_001601e6;
            if (0x20000 < psVar8->maxNbLit) goto LAB_00160243;
            pBVar22 = psVar8->lit;
            if (psVar8->litStart + psVar8->maxNbLit < pBVar22) goto LAB_00160262;
            if (iEnd < local_98) goto LAB_00160224;
            if (local_50 < local_98) {
              ZSTD_safecopyLiterals(pBVar22,(BYTE *)local_98,(BYTE *)local_98,(BYTE *)local_50);
            }
            else {
              uVar7 = *(undefined8 *)(local_98 + 2);
              *(undefined8 *)pBVar22 = *(undefined8 *)local_98;
              *(undefined8 *)(pBVar22 + 8) = uVar7;
            }
            psVar4 = psVar8->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (sVar12 + 4 < 3) goto LAB_00160205;
            if (0xffff < sVar12 + 1) {
              if (psVar8->longLengthType != ZSTD_llt_none) goto LAB_00160281;
              psVar8->longLengthType = ZSTD_llt_matchLength;
              psVar8->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)psVar8->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar12 + 1);
            psVar8->sequences = psVar4 + 1;
            piVar19 = (int *)((long)piVar19 + sVar12 + 4);
            bVar6 = true;
            pBVar22 = local_48;
            uVar11 = uVar10;
            uVar10 = uVar23;
            local_98 = piVar19;
          }
          else {
            bVar6 = false;
            uVar11 = uVar23;
          }
          uVar23 = uVar11;
          uVar11 = uVar10;
        } while (bVar6);
      }
      rep = local_38;
    } while (piVar19 < local_70);
  }
  *rep = uVar11;
  rep[1] = uVar23;
  return (long)iEnd - (long)local_98;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_dictMatchState);
}